

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeAddedConstants.cpp
# Opt level: O1

void __thiscall
wasm::OptimizeAddedConstants::createHelperIndexes()::Creator::visitLocalSet(wasm::LocalSet__
          (void *this,LocalSet *curr)

{
  Index index;
  Expression *pEVar1;
  long lVar2;
  undefined1 *puVar3;
  LocalSet *left;
  Block *expression;
  long lVar4;
  char *pcVar5;
  long lVar6;
  Expression *pEVar7;
  bool bVar8;
  optional<wasm::Type> type;
  Builder local_38;
  Builder builder;
  
  lVar2 = *(long *)((long)this + 0xd8) + 8;
  lVar4 = lVar2;
  for (lVar6 = *(long *)(*(long *)((long)this + 0xd8) + 0x10); lVar6 != 0;
      lVar6 = *(long *)(lVar6 + 0x10 + (ulong)bVar8 * 8)) {
    bVar8 = *(LocalSet **)(lVar6 + 0x20) < curr;
    if (!bVar8) {
      lVar4 = lVar6;
    }
  }
  lVar6 = lVar2;
  if ((lVar4 != lVar2) && (lVar6 = lVar4, curr < *(LocalSet **)(lVar4 + 0x20))) {
    lVar6 = lVar2;
  }
  if (lVar6 != lVar2) {
    pEVar1 = curr->value;
    if (pEVar1->_id != BinaryId) {
      __assert_fail("int(_id) == int(T::SpecificId)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                    ,0x31b,"T *wasm::Expression::cast() [T = wasm::Binary]");
    }
    index = *(Index *)(lVar6 + 0x28);
    pcVar5 = (char *)pEVar1[1].type.id;
    pEVar7 = pEVar1 + 2;
    if (*pcVar5 != '\x0e') {
      pcVar5 = *(char **)pEVar7;
      if (*pcVar5 != '\x0e') {
        __assert_fail("binary->right->is<Const>()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeAddedConstants.cpp"
                      ,0x1b0,
                      "void wasm::OptimizeAddedConstants::createHelperIndexes()::Creator::visitLocalSet(LocalSet *)"
                     );
      }
      pEVar7 = (Expression *)&pEVar1[1].type;
    }
    pEVar1 = *(Expression **)pEVar7;
    local_38.wasm = *(Module **)((long)this + 0xe0);
    puVar3 = (undefined1 *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
    *puVar3 = 8;
    *(Index *)(puVar3 + 0x10) = index;
    *(undefined8 *)(puVar3 + 8) = 2;
    *(undefined1 **)pEVar7 = puVar3;
    left = Builder::makeLocalSet(&local_38,index,pEVar1);
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pcVar5;
    expression = Builder::makeSequence(&local_38,(Expression *)left,(Expression *)curr,type);
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::replaceCurrent
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)this,(Expression *)expression);
  }
  return;
}

Assistant:

void visitLocalSet(LocalSet* curr) {
        auto iter = helperIndexes.find(curr);
        if (iter != helperIndexes.end()) {
          auto index = iter->second;
          auto* binary = curr->value->cast<Binary>();
          Expression** target;
          if (binary->left->is<Const>()) {
            target = &binary->right;
          } else {
            assert(binary->right->is<Const>());
            target = &binary->left;
          }
          auto* value = *target;
          Builder builder(*module);
          *target = builder.makeLocalGet(index, Type::i32);
          replaceCurrent(
            builder.makeSequence(builder.makeLocalSet(index, value), curr));
        }
      }